

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.cpp
# Opt level: O1

int __thiscall
pg::Verifier::verify
          (Verifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  uint uVar1;
  uint uVar2;
  uint64_t *puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int extraout_EAX;
  int extraout_EAX_00;
  void *__s;
  void *__s_00;
  _Map_pointer ppiVar8;
  long lVar9;
  ostream *poVar10;
  runtime_error *prVar11;
  ulong uVar12;
  uint *puVar13;
  long lVar14;
  int *piVar15;
  Verifier *pVVar16;
  Game *pGVar17;
  ulong uVar18;
  Game *pGVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  int v;
  stack<int,_std::deque<int,_std::allocator<int>_>_> st;
  int to;
  uint local_ec;
  Verifier *local_e8;
  uint local_dc;
  long local_d8;
  void *local_d0;
  uint local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined1 local_b8 [8];
  Game *pGStack_b0;
  int *local_a8;
  undefined1 local_98 [48];
  _Map_pointer ppiStack_68;
  _Map_pointer ppiStack_60;
  _Map_pointer ppiStack_58;
  _Map_pointer ppiStack_50;
  _label_vertex local_40;
  
  local_bc = (undefined4)siglen;
  local_c0 = SUB84(sig,0);
  local_d0 = (void *)CONCAT44(local_d0._4_4_,(int)ctx);
  Game::sort(this->game,(int *)0x0);
  Game::build_in_array(this->game,false);
  local_d8 = this->game->n_vertices;
  uVar4 = (uint)local_d8;
  local_e8 = this;
  if (0 < (int)uVar4) {
    uVar20 = 0;
    do {
      pVVar16 = local_e8;
      pGVar17 = local_e8->game;
      puVar3 = (pGVar17->solved)._bits;
      uVar12 = uVar20 >> 6;
      if ((puVar3[uVar12] >> (uVar20 & 0x3f) & 1) == 0) {
        if ((char)local_d0 != '\0') {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar11,"not every vertex is won");
          goto LAB_00148500;
        }
      }
      else {
        uVar21 = 1L << (uVar20 & 0x3f);
        uVar18 = (pGVar17->winner)._bits[uVar12];
        bVar22 = (uVar18 & uVar21) == 0;
        if ((byte)((bVar22 | (byte)local_bc) & (!bVar22 | (byte)local_c0)) == 1) {
          if (((uVar18 & uVar21) != 0) == (((pGVar17->_owner)._bits[uVar12] & uVar21) == 0)) {
            uVar5 = pGVar17->_outedges[pGVar17->_firstouts[uVar20]];
            if (uVar5 != 0xffffffff) {
              puVar13 = (uint *)(pGVar17->_outedges + (long)pGVar17->_firstouts[uVar20] + 1);
              do {
                if (((puVar3[(ulong)(long)(int)uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) == 0) ||
                   ((((pGVar17->winner)._bits[(ulong)(long)(int)uVar5 >> 6] &
                     1L << ((ulong)uVar5 & 0x3f)) == 0) == ((uVar18 & uVar21) != 0))) {
                  poVar10 = local_e8->logger;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,"escape edge from ",0x11);
                  local_98._0_8_ = pVVar16->game;
                  local_98._8_4_ = (int)uVar20;
                  poVar10 = operator<<(poVar10,(_label_vertex *)local_98);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10," to ",4);
                  local_b8 = (undefined1  [8])pVVar16->game;
                  pGStack_b0 = (Game *)CONCAT44(pGStack_b0._4_4_,uVar5);
                  poVar10 = operator<<(poVar10,(_label_vertex *)local_b8);
                  std::endl<char,std::char_traits<char>>(poVar10);
                  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar11,"loser can escape");
                  goto LAB_00148500;
                }
                uVar5 = *puVar13;
                puVar13 = puVar13 + 1;
              } while (uVar5 != 0xffffffff);
            }
            if (pGVar17->strategy[uVar20] != -1) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar11,"losing vertex has strategy");
              goto LAB_00148500;
            }
          }
          else {
            uVar12 = (ulong)pGVar17->strategy[uVar20];
            if (uVar12 == 0xffffffffffffffff) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar11,"winning vertex has no strategy");
LAB_00148500:
              __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            bVar22 = Game::has_edge(pGVar17,(int)uVar20,pGVar17->strategy[uVar20]);
            if (!bVar22) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar11,"strategy is not a valid move");
              goto LAB_00148500;
            }
            if ((((local_e8->game->solved)._bits[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0) ||
               ((((local_e8->game->winner)._bits[uVar12 >> 6] & 1L << (uVar12 & 0x3f)) == 0) ==
                ((uVar18 & uVar21) != 0))) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar11,"strategy leaves dominion");
              goto LAB_00148500;
            }
            local_e8->n_strategies = local_e8->n_strategies + 1;
          }
        }
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != (uVar4 & 0x7fffffff));
  }
  lVar14 = local_d8 << 0x20;
  uVar4 = (uint)local_d8;
  __s = operator_new__(-(ulong)((ulong)(long)(int)uVar4 >> 0x3e != 0) | lVar14 >> 0x1e);
  __s_00 = operator_new__(-(ulong)((ulong)(long)(int)uVar4 >> 0x3d != 0) | lVar14 >> 0x1d);
  if (0 < (int)uVar4) {
    memset(__s,0xff,(ulong)(uVar4 & 0x7fffffff) << 2);
    memset(__s_00,0,(ulong)(uVar4 & 0x7fffffff) << 3);
  }
  local_b8 = (undefined1  [8])0x0;
  pGStack_b0 = (Game *)0x0;
  local_a8 = (int *)0x0;
  local_98._0_8_ = (Game *)0x0;
  ppiStack_58 = (_Map_pointer)0x0;
  ppiStack_50 = (_Map_pointer)0x0;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  local_98._16_8_ = (_Map_pointer)0x0;
  local_98._24_24_ = (undefined1  [24])0x0;
  ppiStack_68 = ppiStack_58;
  ppiStack_60 = ppiStack_50;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)local_98,0);
  uVar5 = uVar4 - 1;
  local_dc = uVar5;
  if (0 < (int)uVar4) {
    pVVar16 = local_e8;
    lVar14 = 0;
    local_d0 = __s_00;
    do {
      pGVar17 = pVVar16->game;
      uVar20 = (ulong)(int)uVar5;
      lVar9 = lVar14;
      local_dc = uVar5;
      if (((pGVar17->solved)._bits[uVar20 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
        uVar18 = 1L << ((ulong)uVar5 & 0x3f);
        uVar12 = (pGVar17->winner)._bits[uVar20 >> 6];
        bVar22 = (uVar12 & uVar18) == 0;
        if ((((byte)((bVar22 | (byte)local_bc) & (!bVar22 | (byte)local_c0)) == 1) &&
            (uVar4 = pGVar17->_priority[uVar20], ((uVar12 & uVar18) != 0) != (bool)((byte)uVar4 & 1)
            )) && (*(uint *)((long)__s + uVar20 * 4) != uVar4)) {
          if (ppiStack_68 == (_Map_pointer)((long)ppiStack_58 + -4)) {
            std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                      ((deque<int,std::allocator<int>> *)local_98,(int *)&local_dc);
          }
          else {
            *(uint *)ppiStack_68 = uVar5;
            ppiStack_68 = (_Map_pointer)((long)ppiStack_68 + 4);
          }
          if (ppiStack_68 != (_Map_pointer)local_98._16_8_) {
            local_c4 = uVar4 & 1;
            local_d8 = lVar14;
            do {
              ppiVar8 = ppiStack_68;
              if (ppiStack_68 == ppiStack_60) {
                ppiVar8 = (_Map_pointer)(ppiStack_50[-1] + 0x80);
              }
              local_ec = *(uint *)((long)ppiVar8 + -4);
              if (*(long *)((long)__s_00 + (long)(int)local_ec * 8) <= lVar14) {
                local_d8 = local_d8 + 1;
                *(long *)((long)__s_00 + (long)(int)local_ec * 8) = local_d8;
                if (pGStack_b0 == (Game *)local_a8) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)local_b8,(iterator)pGStack_b0,
                             (int *)&local_ec);
                }
                else {
                  *(uint *)pGStack_b0 = local_ec;
                  pGStack_b0 = (Game *)((long)pGStack_b0 + 4);
                }
              }
              lVar9 = (long)(int)local_ec;
              uVar20 = *(ulong *)((long)__s_00 + lVar9 * 8);
              iVar7 = (int)uVar20;
              pGVar17 = pVVar16->game;
              if (pGVar17->strategy[lVar9] == -1) {
                if (pGVar17->_outedges[pGVar17->_firstouts[lVar9]] == -1) goto LAB_00148281;
                piVar15 = pGVar17->_outedges + (long)pGVar17->_firstouts[lVar9] + 1;
                bVar22 = false;
                do {
                  uVar5 = piVar15[-1];
                  local_40.g = (Game *)CONCAT44(local_40.g._4_4_,uVar5);
                  lVar9 = (long)(int)uVar5;
                  iVar6 = 0x15;
                  if ((local_e8->game->_priority[lVar9] <= (int)uVar4) &&
                     (*(uint *)((long)__s + lVar9 * 4) != uVar4)) {
                    uVar12 = *(ulong *)((long)local_d0 + lVar9 * 8);
                    if (lVar14 < (long)uVar12) {
                      if ((long)uVar12 < (long)(int)uVar20) {
                        uVar20 = uVar12;
                      }
                      uVar20 = uVar20 & 0xffffffff;
                      iVar6 = 0;
                    }
                    else {
                      if (ppiStack_68 == (_Map_pointer)((long)ppiStack_58 + -4)) {
                        std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                                  ((deque<int,std::allocator<int>> *)local_98,(int *)&local_40);
                      }
                      else {
                        *(uint *)ppiStack_68 = uVar5;
                        ppiStack_68 = (_Map_pointer)((long)ppiStack_68 + 4);
                      }
                      iVar6 = 0x13;
                      bVar22 = true;
                    }
                  }
                  iVar7 = (int)uVar20;
                } while (((iVar6 == 0x15) || (iVar6 == 0)) &&
                        (iVar6 = *piVar15, piVar15 = piVar15 + 1, iVar6 != -1));
              }
              else {
                uVar5 = pGVar17->strategy[lVar9];
                local_40.g = (Game *)CONCAT44(local_40.g._4_4_,uVar5);
                lVar9 = (long)(int)uVar5;
                if (((int)uVar4 < pGVar17->_priority[lVar9]) ||
                   (*(uint *)((long)__s + lVar9 * 4) == uVar4)) {
LAB_00148281:
                  bVar22 = false;
                }
                else {
                  uVar12 = *(ulong *)((long)__s_00 + lVar9 * 8);
                  if (lVar14 < (long)uVar12) {
                    if ((long)iVar7 <= (long)uVar12) {
                      uVar12 = uVar20;
                    }
                    iVar7 = (int)uVar12;
                    bVar22 = false;
                  }
                  else if (ppiStack_68 == (_Map_pointer)((long)ppiStack_58 + -4)) {
                    bVar22 = true;
                    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                              ((deque<int,std::allocator<int>> *)local_98,(int *)&local_40);
                  }
                  else {
                    *(uint *)ppiStack_68 = uVar5;
                    ppiStack_68 = (_Map_pointer)((long)ppiStack_68 + 4);
                    bVar22 = true;
                  }
                }
              }
              __s_00 = local_d0;
              pVVar16 = local_e8;
              if (!bVar22) {
                lVar9 = (long)(int)local_ec;
                if ((long)iVar7 < *(long *)((long)local_d0 + lVar9 * 8)) {
                  *(long *)((long)local_d0 + lVar9 * 8) = (long)iVar7;
                }
                else {
                  pGVar17 = local_e8->game;
                  iVar7 = 0;
                  uVar5 = 0xffffffff;
                  pGVar19 = pGStack_b0;
                  do {
                    if ((undefined1  [8])pGVar19 == local_b8) break;
                    uVar1 = *(uint *)((long)&pGVar19[-1].generator.i + 4);
                    pGVar19 = (Game *)((long)&pGVar19[-1].generator.i + 4);
                    uVar2 = pGVar17->_priority[(int)uVar1];
                    if ((int)uVar5 < (int)uVar2) {
                      uVar5 = uVar2;
                    }
                    iVar7 = iVar7 + 1;
                    *(uint *)((long)__s + (long)(int)uVar1 * 4) = uVar4;
                  } while (uVar1 != local_ec);
                  if (iVar7 < 2) {
                    uVar1 = local_e8->game->strategy[lVar9];
                    if (uVar1 == local_ec) goto LAB_00148305;
                    if ((uVar1 == 0xffffffff) &&
                       (bVar22 = Game::has_edge(local_e8->game,local_ec,local_ec),
                       bVar22 && (uVar5 & 1) == local_c4)) goto LAB_00148534;
                  }
                  else {
LAB_00148305:
                    if ((uVar5 & 1) == local_c4) {
LAB_00148534:
                      poVar10 = pVVar16->logger;
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,
                                 "\x1b[1;31mscc where loser wins\x1b[m with priority \x1b[1;34m",
                                 0x34);
                      poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar5);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\x1b[m",3);
                      pVVar16 = local_e8;
                      pGVar17 = pGStack_b0;
                      goto LAB_0014857d;
                    }
                  }
                  do {
                    pGVar19 = (Game *)((long)&pGStack_b0[-1].generator.i + 4);
                    pGVar17 = pGStack_b0 + -1;
                    pGStack_b0 = pGVar19;
                  } while (*(uint *)((long)&(pGVar17->generator).i + 4) != local_ec);
                }
                if (ppiStack_68 == ppiStack_60) {
                  operator_delete(ppiStack_60,0x200);
                  ppiStack_60 = (_Map_pointer)ppiStack_50[-1];
                  ppiStack_58 = ppiStack_60 + 0x40;
                  ppiStack_68 = (_Map_pointer)((long)ppiStack_60 + 0x1fc);
                  ppiStack_50 = ppiStack_50 + -1;
                }
                else {
                  ppiStack_68 = (_Map_pointer)((long)ppiStack_68 + -4);
                }
              }
              lVar9 = local_d8;
            } while (ppiStack_68 != (_Map_pointer)local_98._16_8_);
          }
        }
      }
      uVar5 = local_dc - 1;
      bVar22 = 0 < (int)local_dc;
      lVar14 = lVar9;
      local_dc = uVar5;
    } while (bVar22);
  }
  operator_delete__(__s);
  operator_delete__(__s_00);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)local_98);
  iVar7 = extraout_EAX;
  if (local_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_b8,(long)local_a8 - (long)local_b8);
    iVar7 = extraout_EAX_00;
  }
  return iVar7;
  while( true ) {
    uVar4 = *(uint *)((long)&pGVar17[-1].generator.i + 4);
    poVar10 = pVVar16->logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    local_40.g = pVVar16->game;
    local_40.v = uVar4;
    operator<<(poVar10,&local_40);
    pGVar17 = (Game *)((long)&pGVar17[-1].generator.i + 4);
    if (uVar4 == local_ec) break;
LAB_0014857d:
    if ((undefined1  [8])pGVar17 == local_b8) break;
  }
  std::endl<char,std::char_traits<char>>(local_e8->logger);
  operator_delete__(__s);
  operator_delete__(local_d0);
  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar11,"loser can win");
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
Verifier::verify(bool fullgame, bool even, bool odd)
{
    // ensure the vertices are ordered properly
    game.ensure_sorted();
    // ensure that the arrays are built
    game.build_in_array(false);

    const int n_vertices = game.vertexcount();

    /**
     * The first loop removes all edges from "won" vertices that are not the strategy.
     * This turns each dominion into a single player game.
     * Also some trivial checks are performed.
     */
    for (int v=0; v < n_vertices; v++) {
        // (for full solutions) check whether every vertex is won
        if (!game.isSolved(v)) {
            if (fullgame) throw std::runtime_error("not every vertex is won");
            else continue;
        }

        const bool winner = game.getWinner(v) ;

        if (winner == 0 and !even) continue; // whatever
        if (winner == 1 and !odd) continue; // whatever

        if (winner == game.owner(v)) {
            // if winner, check whether the strategy stays in the dominion
            int str = game.getStrategy(v);
            if (str == -1) {
                throw std::runtime_error("winning vertex has no strategy");
            } else if (!game.has_edge(v, str)) {
                throw std::runtime_error("strategy is not a valid move");
            } else if (!game.isSolved(str) or game.getWinner(str) != winner) {
                throw std::runtime_error("strategy leaves dominion");
            }
            n_strategies++; // number of checked strategies
        } else {
            // if loser, check whether the loser can escape
            for (auto curedge = game.outs(v); *curedge != -1; curedge++) {
                int to = *curedge;
                if (!game.isSolved(to) or game.getWinner(to) != winner) {
                    logger << "escape edge from " << game.label_vertex(v) << " to " << game.label_vertex(to) << std::endl;
                    throw std::runtime_error("loser can escape");
                }
            }
            // and of course check that no strategy is set
            if (game.getStrategy(v) != -1) throw std::runtime_error("losing vertex has strategy");
        }
    }

    // Allocate datastructures for Tarjan search
    int *done = new int[n_vertices];
    int64_t *low = new int64_t[n_vertices];
    for (int i=0; i<n_vertices; i++) done[i] = -1;
    for (int i=0; i<n_vertices; i++) low[i] = 0;

    std::vector<int> res;
    std::stack<int> st;

    int64_t pre = 0;

    for (int top = n_vertices - 1; top >= 0; top--) {
        // only if a dominion
        if (!game.isSolved(top)) continue;

        int prio = game.priority(top);
        int winner = game.getWinner(top);

        // only compute SCC for a (probably) top vertex
        if (winner == 0 and !even) continue; // don't check even dominions
        if (winner == 1 and !odd) continue; // don't check odd dominions

        // only try to find an SCC where the loser wins
        if (winner == (prio&1)) continue;

        // only run the check if not yet done at priority <prio>
        if (done[top] == prio) continue;

        // set <bot> (in tarjan search) to current pre
        int64_t bot = pre;

        // start the tarjan search at vertex <top>
        st.push(top);

        while (!st.empty()) {
            int v = st.top();

            /**
             * When we see it for the first item, we assign the next number to it and add it to <res>.
             */
            if (low[v] <= bot) {
                low[v] = ++pre;
                res.push_back(v);
            }

            /**
             * Now we check all outgoing (allowed) edges.
             * If seen earlier, then update "min"
             * If new, then 'recurse'
             */
            int min = low[v];
            bool pushed = false;
            if (game.getStrategy(v) != -1) {
                int to = game.getStrategy(v);
                if (game.priority(to) > prio) {
                    // skip if to higher priority
                } else if (done[to] == prio) {
                    // skip if already found scc (done[to] set to prio)
                } else if (low[to] <= bot) {
                    // not visited, add to <st> and break!
                    st.push(to);
                    pushed = true;
                } else {
                    // visited, update min
                    if (low[to] < min) min = low[to];
                }
            } else {
                for (auto curedge = game.outs(v); *curedge != -1; curedge++) {
                    int to = *curedge;
                    // skip if to higher priority
                    if (game.priority(to) > prio) continue;
                    // skip if already found scc (done[to] set to prio)
                    if (done[to] == prio) continue;
                    // check if visited in this search
                    if (low[to] <= bot) {
                        // not visited, add to <st> and break!
                        st.push(to);
                        pushed = true;
                        break;
                    } else {
                        // visited, update min
                        if (low[to] < min) min = low[to];
                    }
                }
            }
            if (pushed) continue; // we pushed a new vertex to <st>...

            // there was no edge to a new vertex
            // check if we are the root of a SCC
            if (min < low[v]) {
                // not the root (outgoing edge to lower ranked vertex)
                low[v] = min;
                st.pop();
                continue;
            }

            /**
             * We're the root!
             * Now we need to figure out if we have cycles with p...
             * Also, mark every vertex in the SCC as "done @ search p"
             */
            int max_prio = -1;
            int scc_size = 0;

            for (auto it=res.rbegin(); it!=res.rend(); it++) {
                int n = *it;
                if (game.priority(n) > max_prio) max_prio = game.priority(n);
                scc_size++;
                done[n] = prio; // mark as done at prio
                if (n == v) break;
            }

            bool cycles = scc_size > 1 or game.getStrategy(v) == v or
                (game.getStrategy(v) == -1 and game.has_edge(v, v));

            if (cycles && (max_prio&1) == (prio&1)) {
                /**
                 * Found! Report.
                 */
                logger << "\033[1;31mscc where loser wins\033[m with priority \033[1;34m" << max_prio << "\033[m";
                for (auto it=res.rbegin(); it!=res.rend(); it++) {
                    int n = *it;
                    logger << " " << game.label_vertex(n);
                    if (n == v) break;
                }
                logger << std::endl;
                delete[] done;
                delete[] low;

                throw std::runtime_error("loser can win");
            }

            /**
             * Not found! Continue.
             */
            for (;;) {
                int n = res.back();
                res.pop_back();
                if (n == v) break;
            }
            st.pop();
        }
    }

    delete[] done;
    delete[] low;
}